

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O0

void __thiscall
helics::TranslatorFederate::handleMessage(TranslatorFederate *this,ActionMessage *command)

{
  __tuple_element_t<1UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> _Var1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view subscriberName;
  string_view sourceType;
  GlobalHandle newSubscriber;
  string_view sourceName;
  GlobalHandle subscriberToRemove;
  GlobalHandle source;
  string_view destType;
  string_view destName;
  GlobalHandle dest;
  Time newMessageTime;
  string_view stype;
  string_view sourceName_00;
  string_view sVar2;
  bool bVar3;
  GlobalFederateId GVar4;
  __tuple_element_t<2UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var5;
  __tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var7;
  PublicationInfo *pPVar8;
  TranslatorInfo *pTVar9;
  TranslatorFederate *in_RSI;
  BaseType *in_RDI;
  string_view sVar10;
  TranslatorInfo *in_stack_00000050;
  ActionMessage *in_stack_00000058;
  TranslatorFederate *in_stack_00000060;
  TranslatorInfo *tranI_7;
  shared_ptr<helics::TranslatorOperator> operation;
  optional<std::any> locker;
  TranslatorInfo *tranI_6;
  TranslatorInfo *tranI_5;
  TranslatorInfo *tranI_4;
  TranslatorInfo *tranI_3;
  TranslatorInfo *tranI_2;
  TranslatorInfo *tranI_1;
  TranslatorInfo *tranI;
  TranslatorInfo *tran;
  string errorString;
  ActionMessage echeck;
  ActionMessage disconnect;
  tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> proc_result;
  TranslatorFederate *in_stack_fffffffffffffb58;
  GlobalHandle in_stack_fffffffffffffb60;
  ActionMessage *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb78;
  action_t in_stack_fffffffffffffb7c;
  InterfaceHandle in_stack_fffffffffffffb80;
  undefined4 uVar11;
  GlobalFederateId in_stack_fffffffffffffb84;
  undefined4 uVar12;
  Time in_stack_fffffffffffffb88;
  GlobalHandle in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  GlobalFederateId in_stack_fffffffffffffb9c;
  GlobalFederateId in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbb4;
  InterfaceHandle IVar13;
  BaseType *in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  IterationRequest in_stack_fffffffffffffbd7;
  TimeCoordinator *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  Time newValueTime;
  Time in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffc00;
  __tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> _Var14;
  undefined1 *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  GlobalHandle in_stack_fffffffffffffc20;
  GlobalHandle in_stack_fffffffffffffc2c;
  string_view in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc54;
  TimeCoordinator *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  undefined1 in_stack_fffffffffffffc68 [16];
  undefined8 in_stack_fffffffffffffd38;
  IterationRequest mode;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  BaseTimeCoordinator *in_stack_fffffffffffffd70;
  GlobalFederateId local_d4;
  undefined1 local_d0 [8];
  BaseType local_c8;
  BaseType local_c0;
  BaseType BVar15;
  undefined4 in_stack_ffffffffffffffec;
  
  mode = (IterationRequest)((ulong)in_stack_fffffffffffffd38 >> 0x38);
  BVar15 = *in_RDI;
  processCoordinatorMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
             in_stack_fffffffffffffc58,(FederateStates)((uint)in_stack_fffffffffffffc54 >> 0x18),
             SUB41((uint)in_stack_fffffffffffffc54 >> 0x10,0),
             (GlobalFederateId)in_stack_fffffffffffffc68._4_4_);
  p_Var5 = std::get<2ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x68ea7d);
  if (((*p_Var5 & 1U) != 0) && ((char)in_RDI[0xa6] == '\x02')) {
    BaseTimeCoordinator::disconnect(in_stack_fffffffffffffd70);
    in_stack_fffffffffffffc08 = local_d0;
    ActionMessage::ActionMessage
              ((ActionMessage *)
               CONCAT44(in_stack_fffffffffffffb84.gid,in_stack_fffffffffffffb80.hid),
               in_stack_fffffffffffffb7c);
    local_c8 = *in_RDI;
    GlobalFederateId::GlobalFederateId(&local_d4,(GlobalBrokerId)0x0);
    local_c0 = local_d4.gid;
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffb60,
               (ActionMessage *)in_stack_fffffffffffffb58);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffb60);
  }
  _Var14 = *(__tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *)
            (in_RDI + 0xa6);
  p_Var6 = std::get<0ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x68eb79);
  sVar10._M_str = in_stack_fffffffffffffbc0;
  sVar10._M_len = in_stack_fffffffffffffbc8;
  if (_Var14 != *p_Var6) {
    p_Var6 = std::get<0ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                       ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                        0x68eb98);
    sVar10._M_str = in_stack_fffffffffffffbc0;
    sVar10._M_len = in_stack_fffffffffffffbc8;
    sVar2._M_str = in_stack_fffffffffffffbc0;
    sVar2._M_len = in_stack_fffffffffffffbc8;
    *(__tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *)
     (in_RDI + 0xa6) = *p_Var6;
    switch((char)in_RDI[0xa6]) {
    case '\x01':
      TimeCoordinator::enteringExecMode
                ((TimeCoordinator *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 mode);
      ActionMessage::ActionMessage
                ((ActionMessage *)
                 CONCAT44(in_stack_fffffffffffffb84.gid,in_stack_fffffffffffffb80.hid),
                 in_stack_fffffffffffffb7c);
      handleMessage(in_RSI,(ActionMessage *)CONCAT44(in_stack_ffffffffffffffec,BVar15));
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffb60);
      sVar10._M_str = in_stack_fffffffffffffbc0;
      sVar10._M_len = in_stack_fffffffffffffbc8;
      break;
    case '\x02':
      newValueTime.internalTimeCode = (baseType)(in_RDI + 10);
      TimeRepresentation<count_time<9,_long>_>::maxVal();
      TimeRepresentation<count_time<9,_long>_>::maxVal();
      TimeRepresentation<count_time<9,_long>_>::maxVal();
      newMessageTime.internalTimeCode._7_1_ = in_stack_fffffffffffffbe7;
      newMessageTime.internalTimeCode._0_7_ = in_stack_fffffffffffffbe0;
      TimeCoordinator::timeRequest
                (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbd7,
                 newValueTime,newMessageTime);
      sVar10._M_str = in_stack_fffffffffffffbc0;
      sVar10._M_len = in_stack_fffffffffffffbc8;
      break;
    default:
      sVar10 = sVar2;
      break;
    case '\x04':
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      bVar3 = SmallBuffer::empty((SmallBuffer *)
                                 ((long)&(in_RSI->mCoord).super_BaseTimeCoordinator.dependencies.
                                         dependencies.
                                         super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                                         ._M_impl.super__Vector_impl_data + 0x10));
      if (bVar3) {
        commandErrorString(in_stack_fffffffffffffb74);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
        in_stack_fffffffffffffbd7 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
        if ((bool)in_stack_fffffffffffffbd7) {
          std::__cxx11::to_string(in_stack_fffffffffffffbac);
          std::operator+((char *)in_stack_fffffffffffffb68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb60);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb58);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb60);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb60);
        }
        sVar10._M_str = in_stack_fffffffffffffbc0;
        sVar10._M_len = in_stack_fffffffffffffbc8;
      }
      else {
        sVar10 = SmallBuffer::to_string((SmallBuffer *)0x68ee47);
        std::__cxx11::string::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb58);
      }
      bVar3 = std::function::operator_cast_to_bool
                        ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)0x68ee9a);
      if (bVar3) {
        in_stack_fffffffffffffbb8 = in_RDI + 0xd0;
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60);
        __args_1._M_len._4_4_ = in_stack_fffffffffffffb7c;
        __args_1._M_len._0_4_ = in_stack_fffffffffffffb78;
        __args_1._M_str._0_4_ = in_stack_fffffffffffffb80.hid;
        __args_1._M_str._4_4_ = in_stack_fffffffffffffb84.gid;
        __args_2._M_str._0_4_ = in_stack_fffffffffffffb70;
        __args_2._M_len = (size_t)in_stack_fffffffffffffb68;
        __args_2._M_str._4_4_ = in_stack_fffffffffffffb74;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                     __args_1,__args_2);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb60);
      break;
    case '\x05':
    }
  }
  p_Var7 = std::get<1ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x68ef4e);
  _Var1 = *p_Var7;
  IVar13.hid = CONCAT13(_Var1,(int3)in_stack_fffffffffffffbb4);
  if (_Var1 == CONTINUE_PROCESSING) {
    GVar4.gid = ActionMessage::action((ActionMessage *)in_RSI);
    if (GVar4.gid == cmd_add_publisher) {
      pTVar9 = getTranslatorInfo((TranslatorFederate *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                                 in_stack_fffffffffffffb84,in_stack_fffffffffffffb80);
      if (pTVar9 != (TranslatorInfo *)0x0) {
        TranslatorInfo::getInputInfo(pTVar9);
        ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffb58);
        ActionMessage::name((ActionMessage *)0x68f2ea);
        ActionMessage::getString_abi_cxx11_
                  (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60.handle.hid.hid);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60);
        ActionMessage::getString_abi_cxx11_
                  (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60.handle.hid.hid);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60);
        sourceName_00._M_len._4_4_ = in_stack_fffffffffffffc1c;
        sourceName_00._M_len._0_4_ = in_stack_fffffffffffffc18;
        sourceName_00._M_str = (char *)in_stack_fffffffffffffc20;
        stype._M_str = (char *)in_RDI;
        stype._M_len = (size_t)in_stack_fffffffffffffc08;
        InputInfo::addSource
                  ((InputInfo *)CONCAT17(_Var14,in_stack_fffffffffffffc00),in_stack_fffffffffffffc2c
                   ,sourceName_00,stype,in_stack_fffffffffffffc40);
        bVar3 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                          ((ActionMessage *)in_RSI,error_flag);
        if (!bVar3) {
          TimeCoordinator::addDependency
                    ((TimeCoordinator *)
                     CONCAT44(in_stack_fffffffffffffb9c.gid,in_stack_fffffffffffffb98),
                     in_stack_fffffffffffffba0);
        }
      }
    }
    else {
      if (GVar4.gid != cmd_pub) {
        if (GVar4.gid == cmd_add_subscriber) {
          pTVar9 = getTranslatorInfo((TranslatorFederate *)
                                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                                     in_stack_fffffffffffffb84,in_stack_fffffffffffffb80);
          if (pTVar9 == (TranslatorInfo *)0x0) {
            return;
          }
          pPVar8 = TranslatorInfo::getPubInfo(pTVar9);
          uVar11 = SUB84(pPVar8,0);
          uVar12 = (undefined4)((ulong)pPVar8 >> 0x20);
          ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffb58);
          ActionMessage::name((ActionMessage *)0x68f45d);
          newSubscriber.handle.hid = in_stack_fffffffffffffba0.gid;
          newSubscriber.fed_id.gid = in_stack_fffffffffffffb9c.gid;
          subscriberName._M_str = (char *)in_stack_fffffffffffffb90;
          subscriberName._M_len = in_stack_fffffffffffffb88.internalTimeCode;
          PublicationInfo::addSubscriber
                    ((PublicationInfo *)CONCAT44(uVar12,uVar11),newSubscriber,subscriberName);
          bVar3 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                            ((ActionMessage *)in_RSI,error_flag);
          if (bVar3) {
            return;
          }
          TimeCoordinator::addDependent
                    ((TimeCoordinator *)
                     CONCAT44(in_stack_fffffffffffffb9c.gid,in_stack_fffffffffffffb98),
                     in_stack_fffffffffffffba0);
          return;
        }
        if (GVar4.gid == cmd_add_endpoint) {
          pTVar9 = getTranslatorInfo((TranslatorFederate *)
                                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                                     in_stack_fffffffffffffb84,in_stack_fffffffffffffb80);
          if (pTVar9 == (TranslatorInfo *)0x0) {
            return;
          }
          bVar3 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                            ((ActionMessage *)in_RSI,destination_target);
          if (!bVar3) {
            TranslatorInfo::getEndpointInfo(pTVar9);
            ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffb58);
            ActionMessage::name((ActionMessage *)0x68f654);
            ActionMessage::getString_abi_cxx11_
                      (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60.handle.hid.hid);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb60);
            source.handle.hid = IVar13.hid;
            source.fed_id.gid = GVar4.gid;
            sourceName._M_len._4_4_ = in_stack_fffffffffffffba4;
            sourceName._M_len._0_4_ = in_stack_fffffffffffffba0.gid;
            sourceName._M_str._0_4_ = in_stack_fffffffffffffba8;
            sourceName._M_str._4_4_ = in_stack_fffffffffffffbac;
            sourceType._M_str._0_4_ = in_stack_fffffffffffffb98;
            sourceType._M_len._0_4_ = in_stack_fffffffffffffb90.fed_id.gid;
            sourceType._M_len._4_4_ = in_stack_fffffffffffffb90.handle.hid;
            sourceType._M_str._4_4_ = in_stack_fffffffffffffb9c.gid;
            EndpointInfo::addSource
                      ((EndpointInfo *)in_stack_fffffffffffffb88.internalTimeCode,source,sourceName,
                       sourceType);
            bVar3 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                              ((ActionMessage *)in_RSI,error_flag);
            if (bVar3) {
              return;
            }
            TimeCoordinator::addDependency
                      ((TimeCoordinator *)
                       CONCAT44(in_stack_fffffffffffffb9c.gid,in_stack_fffffffffffffb98),
                       in_stack_fffffffffffffba0);
            return;
          }
          TranslatorInfo::getEndpointInfo(pTVar9);
          ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffb58);
          ActionMessage::name((ActionMessage *)0x68f572);
          ActionMessage::getString_abi_cxx11_
                    (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60.handle.hid.hid);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb60);
          dest.handle.hid._3_1_ = in_stack_fffffffffffffbd7;
          dest._0_7_ = in_stack_fffffffffffffbd0;
          destName._M_str = (char *)sVar10._M_len;
          destName._M_len = (size_t)sVar10._M_str;
          destType._M_len._4_4_ = IVar13.hid;
          destType._M_len._0_4_ = GVar4.gid;
          destType._M_str = (char *)in_stack_fffffffffffffbb8;
          EndpointInfo::addDestination
                    ((EndpointInfo *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                     dest,destName,destType);
          bVar3 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                            ((ActionMessage *)in_RSI,error_flag);
          if (bVar3) {
            return;
          }
          TimeCoordinator::addDependent
                    ((TimeCoordinator *)
                     CONCAT44(in_stack_fffffffffffffb9c.gid,in_stack_fffffffffffffb98),
                     in_stack_fffffffffffffba0);
          return;
        }
        if (GVar4.gid == cmd_close_interface) {
          ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffb58);
          gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::find
                    ((MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *)
                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     (GlobalHandle *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          return;
        }
        if (GVar4.gid == cmd_remove_subscriber) {
          ActionMessage::getDest((ActionMessage *)in_stack_fffffffffffffb58);
          pTVar9 = getTranslatorInfo(in_stack_fffffffffffffb58,in_stack_fffffffffffffb60);
          if (pTVar9 == (TranslatorInfo *)0x0) {
            return;
          }
          TranslatorInfo::getPubInfo(pTVar9);
          ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffb58);
          subscriberToRemove.handle.hid = IVar13.hid;
          subscriberToRemove.fed_id.gid = GVar4.gid;
          PublicationInfo::removeSubscriber
                    ((PublicationInfo *)
                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                     subscriberToRemove);
          return;
        }
        if (GVar4.gid == cmd_remove_publication) {
          ActionMessage::getDest((ActionMessage *)in_stack_fffffffffffffb58);
          pTVar9 = getTranslatorInfo(in_stack_fffffffffffffb58,in_stack_fffffffffffffb60);
          if (pTVar9 == (TranslatorInfo *)0x0) {
            return;
          }
          TranslatorInfo::getInputInfo(pTVar9);
          ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffb58);
          InputInfo::removeSource
                    ((InputInfo *)
                     CONCAT44(in_stack_fffffffffffffb84.gid,in_stack_fffffffffffffb80.hid),
                     in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          return;
        }
        if (GVar4.gid == cmd_remove_endpoint) {
          ActionMessage::getDest((ActionMessage *)in_stack_fffffffffffffb58);
          pTVar9 = getTranslatorInfo(in_stack_fffffffffffffb58,in_stack_fffffffffffffb60);
          if (pTVar9 == (TranslatorInfo *)0x0) {
            return;
          }
          TranslatorInfo::getEndpointInfo(pTVar9);
          ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffb58);
          EndpointInfo::removeTarget
                    ((EndpointInfo *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                     in_stack_fffffffffffffc20);
          return;
        }
        if (GVar4.gid == cmd_core_configure) {
          if ((in_RSI->mCoreID).gid != 0x23e) {
            return;
          }
          pTVar9 = getTranslatorInfo((TranslatorFederate *)
                                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                                     in_stack_fffffffffffffb84,in_stack_fffffffffffffb80);
          if (pTVar9 == (TranslatorInfo *)0x0) {
            return;
          }
          std::
          function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
          ::operator()((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
                        *)in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20))
          ;
          gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                    ((AirLock<std::any,_std::mutex,_std::condition_variable> *)
                     in_stack_fffffffffffffb88.internalTimeCode);
          bVar3 = std::optional::operator_cast_to_bool((optional<std::any> *)0x68f7a5);
          if (bVar3) {
            std::optional<std::any>::operator*((optional<std::any> *)0x68f7b8);
            std::any_cast<std::shared_ptr<helics::TranslatorOperator>>
                      ((any *)in_stack_fffffffffffffb68);
            std::shared_ptr<helics::TranslatorOperator>::operator=
                      ((shared_ptr<helics::TranslatorOperator> *)in_stack_fffffffffffffb60,
                       (shared_ptr<helics::TranslatorOperator> *)in_stack_fffffffffffffb58);
            std::shared_ptr<helics::TranslatorOperator>::~shared_ptr
                      ((shared_ptr<helics::TranslatorOperator> *)0x68f7f0);
          }
          std::optional<std::any>::~optional((optional<std::any> *)0x68f825);
          return;
        }
        if (GVar4.gid != cmd_send_message) {
          return;
        }
      }
      pTVar9 = getTranslatorInfo((TranslatorFederate *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                                 in_stack_fffffffffffffb84,in_stack_fffffffffffffb80);
      if (pTVar9 != (TranslatorInfo *)0x0) {
        executeTranslator(in_stack_00000060,in_stack_00000058,in_stack_00000050);
      }
    }
  }
  else if ((_Var1 != DELAY_MESSAGE) && (_Var1 == REPROCESS_MESSAGE)) {
    bVar3 = GlobalFederateId::operator!=
                      ((GlobalFederateId *)&(in_RSI->mName)._M_string_length,
                       (GlobalFederateId)*in_RDI);
    if (bVar3) {
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffb60,
                 (ActionMessage *)in_stack_fffffffffffffb58);
    }
    else {
      handleMessage(in_RSI,(ActionMessage *)CONCAT44(in_stack_ffffffffffffffec,BVar15));
    }
  }
  return;
}

Assistant:

void TranslatorFederate::handleMessage(ActionMessage& command)
{
    auto proc_result = processCoordinatorMessage(command, &mCoord, current_state, false, mFedID);

    if (std::get<2>(proc_result) && current_state == FederateStates::EXECUTING) {
        mCoord.disconnect();
        ActionMessage disconnect(CMD_DISCONNECT);
        disconnect.source_id = mFedID;
        disconnect.dest_id = parent_broker_id;
        mQueueMessage(disconnect);
    }
    if (current_state != std::get<0>(proc_result)) {
        current_state = std::get<0>(proc_result);
        switch (current_state) {
            case FederateStates::INITIALIZING:
                mCoord.enteringExecMode(IterationRequest::NO_ITERATIONS);
                {
                    ActionMessage echeck{CMD_EXEC_CHECK};
                    echeck.dest_id = mFedID;
                    echeck.source_id = mFedID;
                    handleMessage(echeck);
                }
                break;
            case FederateStates::EXECUTING:
                mCoord.timeRequest(Time::maxVal(),
                                   IterationRequest::NO_ITERATIONS,
                                   Time::maxVal(),
                                   Time::maxVal());
                break;
            case FederateStates::FINISHED:
                break;
            case FederateStates::ERRORED: {
                std::string errorString;
                if (command.payload.empty()) {
                    errorString = commandErrorString(command.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(command.messageID);
                    }
                } else {
                    errorString = command.payload.to_string();
                }
                if (mLogger) {
                    mLogger(HELICS_LOG_LEVEL_ERROR, mName, errorString);
                }
            } break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (command.dest_id != mFedID) {
                mSendMessage(command);
                return;
            }
            return handleMessage(command);
        case MessageProcessingResult::DELAY_MESSAGE:
        default:
            return;
    }
    switch (command.action()) {
        case CMD_CLOSE_INTERFACE: {
            auto* tran = translators.find(command.getSource());
            if (tran != nullptr) {
                // TODO(PT) actually close the interface
            }
        } break;

        case CMD_REMOVE_ENDPOINT: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getEndpointInfo()->removeTarget(command.getSource());
            }
        } break;
        case CMD_REMOVE_PUBLICATION: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getInputInfo()->removeSource(command.getSource(), timeZero);
            }

        } break;
        case CMD_REMOVE_SUBSCRIBER: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getPubInfo()->removeSubscriber(command.getSource());
            }

        } break;
        case CMD_ADD_PUBLISHER: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                tranI->getInputInfo()->addSource(command.getSource(),
                                                 command.name(),
                                                 command.getString(typeStringLoc),
                                                 command.getString(unitStringLoc));

                if (!checkActionFlag(command, error_flag)) {
                    mCoord.addDependency(command.source_id);
                }
            }
        } break;
        case CMD_ADD_SUBSCRIBER: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                tranI->getPubInfo()->addSubscriber(command.getSource(), command.name());

                if (!checkActionFlag(command, error_flag)) {
                    mCoord.addDependent(command.source_id);
                }
            }
        } break;
        case CMD_ADD_ENDPOINT: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                if (checkActionFlag(command, destination_target)) {
                    tranI->getEndpointInfo()->addDestination(command.getSource(),
                                                             command.name(),
                                                             command.getString(typeStringLoc));
                    if (!checkActionFlag(command, error_flag)) {
                        mCoord.addDependent(command.source_id);
                    }
                } else {
                    tranI->getEndpointInfo()->addSource(command.getSource(),
                                                        command.name(),
                                                        command.getString(typeStringLoc));
                    if (!checkActionFlag(command, error_flag)) {
                        mCoord.addDependency(command.source_id);
                    }
                }
            }

        } break;
        case CMD_CORE_CONFIGURE:
            if (command.messageID == UPDATE_TRANSLATOR_OPERATOR) {
                auto* tranI = getTranslatorInfo(mFedID, command.source_handle);
                if (tranI != nullptr) {
                    auto locker = mGetAirLock(command.counter).try_unload();
                    if (locker) {
                        auto operation =
                            std::any_cast<std::shared_ptr<TranslatorOperator>>(std::move(*locker));
                        tranI->tranOp = std::move(operation);
                    }
                }
            }
            break;
        case CMD_SEND_MESSAGE:
        case CMD_PUB: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                executeTranslator(command, tranI);
            }
        } break;
        default:
            break;
    }
}